

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_GetFloorCeilingZ(FCheckPosition *tmf,int flags)

{
  int iVar1;
  FTextureID FVar2;
  double dVar3;
  sector_t *local_50;
  int local_48;
  F3DFloor *local_40;
  F3DFloor *fff;
  F3DFloor *ffc;
  sector_t *local_20;
  sector_t *sec;
  FCheckPosition *pFStack_10;
  int flags_local;
  FCheckPosition *tmf_local;
  
  sec._4_4_ = flags;
  pFStack_10 = tmf;
  if (((flags & 2U) == 0) || (tmf->thing->Sector == (sector_t *)0x0)) {
    TVector2<double>::TVector2((TVector2<double> *)&ffc,&tmf->pos);
    local_50 = P_PointInSector((DVector2 *)&ffc);
  }
  else {
    local_50 = tmf->sector;
  }
  local_20 = local_50;
  dVar3 = sector_t::NextHighestCeilingAt
                    (local_50,(pFStack_10->pos).X,(pFStack_10->pos).Y,(pFStack_10->pos).Z,
                     (pFStack_10->pos).Z + pFStack_10->thing->Height,sec._4_4_,
                     &pFStack_10->ceilingsector,&fff);
  pFStack_10->ceilingz = dVar3;
  dVar3 = sector_t::NextLowestFloorAt
                    (local_20,(pFStack_10->pos).X,(pFStack_10->pos).Y,(pFStack_10->pos).Z,sec._4_4_,
                     pFStack_10->thing->MaxStepHeight,&pFStack_10->floorsector,&local_40);
  pFStack_10->dropoffz = dVar3;
  pFStack_10->floorz = dVar3;
  if (local_40 == (F3DFloor *)0x0) {
    FVar2 = sector_t::GetTexture(pFStack_10->floorsector,0);
    (pFStack_10->floorpic).texnum = FVar2.texnum;
    iVar1 = sector_t::GetTerrain(pFStack_10->floorsector,0);
    pFStack_10->floorterrain = iVar1;
  }
  else {
    (pFStack_10->floorpic).texnum = ((local_40->top).texture)->texnum;
    iVar1 = sector_t::GetTerrain(local_40->model,(local_40->top).isceiling);
    pFStack_10->floorterrain = iVar1;
  }
  if (fff == (F3DFloor *)0x0) {
    local_48 = (int)sector_t::GetTexture(pFStack_10->ceilingsector,1);
  }
  else {
    local_48 = ((fff->bottom).texture)->texnum;
  }
  (pFStack_10->ceilingpic).texnum = local_48;
  pFStack_10->sector = local_20;
  return;
}

Assistant:

void P_GetFloorCeilingZ(FCheckPosition &tmf, int flags)
{
	sector_t *sec = (!(flags & FFCF_SAMESECTOR) || tmf.thing->Sector == NULL)? P_PointInSector(tmf.pos) : tmf.sector;
	F3DFloor *ffc, *fff;

	tmf.ceilingz = sec->NextHighestCeilingAt(tmf.pos.X, tmf.pos.Y, tmf.pos.Z, tmf.pos.Z + tmf.thing->Height, flags, &tmf.ceilingsector, &ffc);
	tmf.floorz = tmf.dropoffz = sec->NextLowestFloorAt(tmf.pos.X, tmf.pos.Y, tmf.pos.Z, flags, tmf.thing->MaxStepHeight, &tmf.floorsector, &fff);

	if (fff)
	{
		tmf.floorpic = *fff->top.texture;
		tmf.floorterrain = fff->model->GetTerrain(fff->top.isceiling);
	}
	else
	{
		tmf.floorpic = tmf.floorsector->GetTexture(sector_t::floor);
		tmf.floorterrain = tmf.floorsector->GetTerrain(sector_t::floor);
	}
	tmf.ceilingpic = ffc ? *ffc->bottom.texture : tmf.ceilingsector->GetTexture(sector_t::ceiling);
	tmf.sector = sec;

}